

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

void ckh_delete(tsd_t *tsd,ckh_t *ckh)

{
  long *plVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ckhc_t *ptr;
  void *pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  rtree_leaf_elm_t *prVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  rtree_ctx_t *prVar13;
  rtree_ctx_t local_1b0;
  
  ptr = ckh->tab;
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    rtree_ctx_data_init(prVar13);
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar12 = (uint)((ulong)ptr >> 0x1e) & 0xf;
  uVar11 = (ulong)ptr & 0xffffffffc0000000;
  uVar8 = (ulong)(uVar12 << 4);
  puVar2 = (ulong *)((long)&prVar13->cache[0].leafkey + uVar8);
  uVar8 = *(ulong *)((long)&prVar13->cache[0].leafkey + uVar8);
  if (uVar8 == uVar11) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar13->l2_cache[0].leafkey == uVar11) {
    prVar9 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = uVar8;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar11;
    puVar2[1] = (ulong)prVar9;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    for (lVar10 = 0x118; lVar10 != 0x188; lVar10 = lVar10 + 0x10) {
      if (*(ulong *)((long)prVar13->cache + lVar10 + -8) == uVar11) {
        uVar6 = *(ulong *)((long)&prVar13->cache[0].leafkey + lVar10);
        puVar3 = (undefined8 *)((long)prVar13->cache + lVar10 + -0x18);
        uVar7 = puVar3[1];
        puVar4 = (undefined8 *)((long)prVar13->cache + lVar10 + -8);
        *puVar4 = *puVar3;
        puVar4[1] = uVar7;
        *(ulong *)((long)prVar13->cache + lVar10 + -0x18) = uVar8;
        *(ulong *)((long)(prVar13->cache + -1) + lVar10) = puVar2[1];
        *puVar2 = uVar11;
        puVar2[1] = uVar6;
        prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar6);
        goto LAB_00114d71;
      }
    }
    prVar9 = rtree_leaf_elm_lookup_hard
                       ((tsdn_t *)tsd,&extents_rtree,prVar13,(uintptr_t)ptr,true,false);
  }
LAB_00114d71:
  pvVar5 = arenas[*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe) &
                  0xfff].repr;
  if (tsd == (tsd_t *)0x0) {
    prVar13 = &local_1b0;
    rtree_ctx_data_init(prVar13);
  }
  else {
    prVar13 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar8 = (ulong)(uVar12 << 4);
  puVar2 = (ulong *)((long)&prVar13->cache[0].leafkey + uVar8);
  uVar8 = *(ulong *)((long)&prVar13->cache[0].leafkey + uVar8);
  if (uVar8 == uVar11) {
    prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if (prVar13->l2_cache[0].leafkey == uVar11) {
    prVar9 = prVar13->l2_cache[0].leaf;
    prVar13->l2_cache[0].leafkey = uVar8;
    prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = uVar11;
    puVar2[1] = (ulong)prVar9;
    prVar9 = (rtree_leaf_elm_t *)
             ((long)&(prVar9->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    for (lVar10 = 0x118; lVar10 != 0x188; lVar10 = lVar10 + 0x10) {
      if (*(ulong *)((long)prVar13->cache + lVar10 + -8) == uVar11) {
        uVar6 = *(ulong *)((long)&prVar13->cache[0].leafkey + lVar10);
        puVar3 = (undefined8 *)((long)prVar13->cache + lVar10 + -0x18);
        uVar7 = puVar3[1];
        puVar4 = (undefined8 *)((long)prVar13->cache + lVar10 + -8);
        *puVar4 = *puVar3;
        puVar4[1] = uVar7;
        *(ulong *)((long)prVar13->cache + lVar10 + -0x18) = uVar8;
        *(ulong *)((long)(prVar13->cache + -1) + lVar10) = puVar2[1];
        *puVar2 = uVar11;
        puVar2[1] = uVar6;
        prVar9 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar6);
        goto LAB_00114dc2;
      }
    }
    prVar9 = rtree_leaf_elm_lookup_hard
                       ((tsdn_t *)tsd,&extents_rtree,prVar13,(uintptr_t)ptr,true,false);
  }
LAB_00114dc2:
  LOCK();
  plVar1 = (long *)((long)pvVar5 + 0x68);
  *plVar1 = *plVar1 - sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd,ptr);
  return;
}

Assistant:

void
ckh_delete(tsd_t *tsd, ckh_t *ckh) {
	assert(ckh != NULL);

#ifdef CKH_VERBOSE
	malloc_printf(
	    "%s(%p): ngrows: %"FMTu64", nshrinks: %"FMTu64","
	    " nshrinkfails: %"FMTu64", ninserts: %"FMTu64","
	    " nrelocs: %"FMTu64"\n", __func__, ckh,
	    (unsigned long long)ckh->ngrows,
	    (unsigned long long)ckh->nshrinks,
	    (unsigned long long)ckh->nshrinkfails,
	    (unsigned long long)ckh->ninserts,
	    (unsigned long long)ckh->nrelocs);
#endif

	idalloctm(tsd_tsdn(tsd), ckh->tab, NULL, NULL, true, true);
	if (config_debug) {
		memset(ckh, JEMALLOC_FREE_JUNK, sizeof(ckh_t));
	}
}